

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O1

void __thiscall QNetworkAccessCache::releaseEntry(QNetworkAccessCache *this,QByteArray *key)

{
  int *piVar1;
  Node<QByteArray,_QNetworkAccessCache::Node_*> *pNVar2;
  Node **ppNVar3;
  Node *pNVar4;
  
  if (*(Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> **)(this + 0x10) !=
      (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_>::
             findNode<QByteArray>
                       (*(Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> **)
                         (this + 0x10),key);
    if (pNVar2 != (Node<QByteArray,_QNetworkAccessCache::Node_*> *)0x0) {
      ppNVar3 = &pNVar2->value;
      goto LAB_0017b9d3;
    }
  }
  ppNVar3 = (Node **)0x0;
LAB_0017b9d3:
  if (ppNVar3 == (Node **)0x0) {
    pNVar4 = (Node *)0x0;
  }
  else {
    pNVar4 = *ppNVar3;
  }
  if (pNVar4 == (Node *)0x0) {
    releaseEntry((QNetworkAccessCache *)key);
  }
  else {
    piVar1 = &pNVar4->useCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      if (pNVar4->object->expires == true) {
        linkEntry(this,key);
      }
      if (*(Node **)(this + 0x18) == pNVar4) {
        updateTimer(this);
        return;
      }
    }
  }
  return;
}

Assistant:

void QNetworkAccessCache::releaseEntry(const QByteArray &key)
{
    Node *node = hash.value(key);
    if (!node) {
        qWarning("QNetworkAccessCache::releaseEntry: trying to release key '%s' that is not in cache", key.constData());
        return;
    }

    Q_ASSERT(node->useCount > 0);

    if (!--node->useCount) {
        // no objects waiting; add it back to the expiry list
        if (node->object->expires)
            linkEntry(key);

        if (firstExpiringNode == node)
            updateTimer();
    }
}